

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AstCompiler.cpp
# Opt level: O3

void __thiscall
compiler::CompilerAstWalker::onEnterBreakStatementAstNode
          (CompilerAstWalker *this,BreakStatementAstNode *param_1)

{
  element_type *peVar1;
  pointer puVar2;
  pointer puVar3;
  iterator __position;
  iterator iVar4;
  undefined8 uVar5;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__tmp;
  long lVar6;
  unsigned_long local_68;
  size_t loopIndex;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50;
  unsigned_long local_40;
  size_t breakIndex;
  shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> vec;
  
  peVar1 = (this->ec).super___shared_ptr<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  puVar2 = (peVar1->loopStartIndices).
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar3 = (peVar1->loopStartIndices).
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
  loopIndex = (size_t)&local_50;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&loopIndex,
             "onEnterBreakStatementAstNode encountered break statement but loopStartIndices empty",
             "");
  Error::assertWithPanic(puVar2 != puVar3,(string *)&loopIndex);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)loopIndex != &local_50) {
    operator_delete((void *)loopIndex,(ulong)(local_50._M_allocated_capacity + 1));
  }
  peVar1 = (this->ec).super___shared_ptr<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  local_40 = (long)(peVar1->byteCode).
                   super__Vector_base<bytecode::ByteCode,_std::allocator<bytecode::ByteCode>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(peVar1->byteCode).
                   super__Vector_base<bytecode::ByteCode,_std::allocator<bytecode::ByteCode>_>.
                   _M_impl.super__Vector_impl_data._M_start >> 4;
  puVar2 = (peVar1->loopStartIndices).
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar3 = (peVar1->loopStartIndices).
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
  lVar6 = (long)puVar3 - (long)puVar2 >> 3;
  if (puVar3 != puVar2) {
    local_68 = puVar2[lVar6 + -1];
    iVar4 = std::
            _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find(&(peVar1->breakStatementsForLoops)._M_h,&local_68);
    breakIndex = 0;
    vec.
    super___shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)0x0;
    if (iVar4.
        super__Node_iterator_base<std::pair<const_unsigned_long,_std::shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_false>
        ._M_cur == (__node_type *)0x0) {
      local_50._M_allocated_capacity = (size_type)operator_new(0x28);
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50._M_allocated_capacity)->_M_use_count
           = 1;
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50._M_allocated_capacity)->
      _M_weak_count = 1;
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50._M_allocated_capacity)->
      _vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00130a70;
      local_58 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 (local_50._M_allocated_capacity + 0x10);
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_50._M_allocated_capacity + 0x10))->
      _vptr__Sp_counted_base = (_func_int **)0x0;
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_50._M_allocated_capacity + 0x10))->
      _M_use_count = 0;
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_50._M_allocated_capacity + 0x10))->
      _M_weak_count = 0;
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_50._M_allocated_capacity + 0x20))->
      _vptr__Sp_counted_base = (_func_int **)0x0;
      peVar1 = (this->ec).super___shared_ptr<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      loopIndex = local_68;
      if (__libc_single_threaded == '\0') {
        LOCK();
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50._M_allocated_capacity)->
        _M_use_count = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       local_50._M_allocated_capacity)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50._M_allocated_capacity)->
        _M_use_count = 2;
      }
      breakIndex = (size_t)local_58;
      vec.
      super___shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = (element_type *)local_50._M_allocated_capacity;
      std::
      _Hashtable<unsigned_long,std::pair<unsigned_long_const,std::shared_ptr<std::vector<unsigned_long,std::allocator<unsigned_long>>>>,std::allocator<std::pair<unsigned_long_const,std::shared_ptr<std::vector<unsigned_long,std::allocator<unsigned_long>>>>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
      ::
      _M_emplace<std::pair<unsigned_long,std::shared_ptr<std::vector<unsigned_long,std::allocator<unsigned_long>>>>>
                ((_Hashtable<unsigned_long,std::pair<unsigned_long_const,std::shared_ptr<std::vector<unsigned_long,std::allocator<unsigned_long>>>>,std::allocator<std::pair<unsigned_long_const,std::shared_ptr<std::vector<unsigned_long,std::allocator<unsigned_long>>>>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                  *)&peVar1->breakStatementsForLoops,&loopIndex);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50._M_allocated_capacity !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50._M_allocated_capacity);
      }
    }
    else {
      breakIndex = *(size_t *)
                    ((long)iVar4.
                           super__Node_iterator_base<std::pair<const_unsigned_long,_std::shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_false>
                           ._M_cur + 0x10);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&vec,
                 (__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                 ((long)iVar4.
                        super__Node_iterator_base<std::pair<const_unsigned_long,_std::shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_false>
                        ._M_cur + 0x18));
    }
    __position._M_current = *(unsigned_long **)(breakIndex + 8);
    if (__position._M_current == *(unsigned_long **)(breakIndex + 0x10)) {
      std::vector<unsigned_long,std::allocator<unsigned_long>>::
      _M_realloc_insert<unsigned_long_const&>
                ((vector<unsigned_long,std::allocator<unsigned_long>> *)breakIndex,__position,
                 &local_40);
    }
    else {
      *__position._M_current = local_40;
      *(unsigned_long **)(breakIndex + 8) = __position._M_current + 1;
    }
    emit(this,Jump);
    if (vec.
        super___shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr != (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 vec.
                 super___shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr);
    }
    return;
  }
  uVar5 = std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                     lVar6 + -1);
  __clang_call_terminate(uVar5);
}

Assistant:

void onEnterBreakStatementAstNode(BreakStatementAstNode*  /*node*/) noexcept override {
    Error::assertWithPanic(!this->ec->loopStartIndices.empty(),
      "onEnterBreakStatementAstNode encountered break statement but loopStartIndices empty");

    std::size_t breakIndex = this->ec->byteCode.size();
    std::size_t loopIndex = this->ec->loopStartIndices.at(this->ec->loopStartIndices.size() - 1);

    auto find = this->ec->breakStatementsForLoops.find(loopIndex);

    std::shared_ptr<std::vector<std::size_t>> vec = nullptr;

    if (find == this->ec->breakStatementsForLoops.end()) {
      vec = std::make_shared<std::vector<std::size_t>>();
      this->ec->breakStatementsForLoops.insert(std::make_pair(loopIndex, vec));
    } else {
      vec = find->second;
    }

    vec->push_back(breakIndex);

    this->emit(bytecode::ByteCodeInstruction::Jump);
  }